

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O1

Time __thiscall libwebvtt::Time::operator+(Time *this,presentation_t d)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  Time TVar5;
  
  lVar1._0_4_ = this->hours;
  lVar1._4_4_ = this->minutes;
  lVar2._0_4_ = this->seconds;
  lVar2._4_4_ = this->milliseconds;
  uVar3 = (lVar2 >> 0x20) + d + (lVar1 >> 0x20) * 60000 + (long)(int)(undefined4)lVar1 * 3600000 +
          (long)(int)(undefined4)lVar2 * 1000;
  if (-1 < (long)uVar3) {
    iVar4 = (int)(uVar3 / 1000);
    TVar5.seconds = iVar4 % 0x3c;
    TVar5.milliseconds = (int)uVar3 - (int)((uVar3 / 1000) * 0x3e800000000 >> 0x20);
    TVar5.minutes = (iVar4 / 0xe10) * -0x3c + iVar4 / 0x3c;
    TVar5.hours = iVar4 / 0xe10;
    return TVar5;
  }
  return (Time)ZEXT816(0);
}

Assistant:

Time Time::operator+(presentation_t d) const {
  Time t(*this);
  t += d;
  return t;
}